

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * cmGlobalNinjaGenerator::EncodeIdent
                   (string *__return_storage_ptr__,string *ident,ostream *vars)

{
  unary_negate<std::pointer_to_unary_function<char,_bool>_> __pred;
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 in_stack_fffffffffffffd98;
  pointer_to_unary_function<char,_bool> in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200 [48];
  ostringstream local_1d0 [8];
  ostringstream names;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  _func_bool_char *local_50 [2];
  unary_negate<std::pointer_to_unary_function<char,_bool>_> *local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  ostream *local_20;
  ostream *vars_local;
  string *ident_local;
  string *result;
  
  local_20 = vars;
  vars_local = (ostream *)ident;
  ident_local = __return_storage_ptr__;
  local_30._M_current = (char *)std::__cxx11::string::begin();
  local_38._M_current = (char *)std::__cxx11::string::end();
  local_50[0] = (_func_bool_char *)std::ptr_fun<char,bool>(IsIdentChar);
  local_40 = std::not1<std::pointer_to_unary_function<char,bool>>
                       ((unary_negate<std::pointer_to_unary_function<char,_bool>_> *)local_50,
                        (pointer_to_unary_function<char,_bool> *)ident);
  __pred._M_pred._M_ptr = in_stack_fffffffffffffda0._M_ptr;
  __pred._0_8_ = in_stack_fffffffffffffd98;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::unary_negate<std::pointer_to_unary_function<char,bool>>>
                       (local_30,local_38,__pred);
  local_58._M_current = (char *)std::__cxx11::string::end();
  bVar2 = __gnu_cxx::operator!=(&local_28,&local_58);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    poVar3 = std::operator<<((ostream *)local_1d0,"ident");
    uVar1 = EncodeIdent::VarNum;
    EncodeIdent::VarNum = EncodeIdent::VarNum + 1;
    std::ostream::operator<<(poVar3,uVar1);
    poVar3 = local_20;
    std::__cxx11::ostringstream::str();
    poVar3 = std::operator<<(poVar3,local_200);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)vars_local);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_200);
    std::__cxx11::ostringstream::str();
    std::operator+(__return_storage_ptr__,"$",&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream(local_1d0);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)vars_local);
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__," ","$ ");
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,":","$:");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodeIdent(const std::string& ident,
                                                std::ostream& vars)
{
  if (std::find_if(ident.begin(), ident.end(),
                   std::not1(std::ptr_fun(IsIdentChar))) != ident.end()) {
    static unsigned VarNum = 0;
    std::ostringstream names;
    names << "ident" << VarNum++;
    vars << names.str() << " = " << ident << "\n";
    return "$" + names.str();
  }
  std::string result = ident;
  cmSystemTools::ReplaceString(result, " ", "$ ");
  cmSystemTools::ReplaceString(result, ":", "$:");
  return result;
}